

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O3

Vector3d *
opengv::generateRandomDirectionTranslation(Vector3d *__return_storage_ptr__,double parallax)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  ActualDstType actualDst;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Matrix3d rotation;
  undefined1 local_58 [16];
  double local_48;
  undefined1 local_40 [16];
  double local_30;
  undefined1 local_28 [16];
  double local_18;
  
  generateRandomRotation();
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = 1.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = 0.0;
  dVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[0];
  auVar5._8_8_ = dVar1;
  auVar5._0_8_ = dVar1;
  auVar5 = vmulpd_avx512vl(local_58,auVar5);
  dVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1];
  dVar2 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[0];
  dVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1];
  auVar4._8_8_ = dVar3;
  auVar4._0_8_ = dVar3;
  auVar5 = vfmadd132pd_avx512vl(local_40,auVar5,auVar4);
  dVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[2];
  auVar6._8_8_ = dVar3;
  auVar6._0_8_ = dVar3;
  auVar5 = vfmadd231pd_fma(auVar5,auVar6,local_28);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = parallax * auVar5._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = parallax * auVar5._8_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = (dVar2 * local_48 + dVar1 * local_30 + dVar3 * local_18) * parallax;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d
opengv::generateRandomDirectionTranslation( double parallax )
{
  Matrix3d rotation = generateRandomRotation();
  Vector3d translation;
  translation << 1.0, 0.0, 0.0;
  translation = rotation * translation;
  translation = parallax * translation;
  return translation;
}